

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O1

EStatusCode __thiscall
PDFParser::ParseXrefFromXrefStream
          (PDFParser *this,XrefEntryInputVector *inXrefTable,ObjectIDType inXrefSize,
          PDFStreamInput *inXrefStream,ObjectIDType *outReadTableSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  PDFParser *this_00;
  EPDFObjectType EVar3;
  EStatusCode EVar4;
  IByteReader *pIVar5;
  PDFDictionary *pPVar6;
  PDFObject *pPVar7;
  unsigned_long uVar8;
  PDFInteger *this_01;
  longlong lVar9;
  LongFilePositionType inOffsetFromStart;
  ObjectIDType inSegmentStartObject;
  ulong uVar10;
  Trace *pTVar11;
  ulong uVar12;
  char *inFormat;
  ulong uVar13;
  int iVar14;
  int *inEntryWidths;
  PDFObjectCastPtr<PDFInteger> widthObject;
  PDFObjectCastPtr<PDFArray> wArray;
  RefCountPtr<PDFDictionary> streamDictionary;
  PDFObjectCastPtr<PDFInteger> xrefSize;
  PDFObjectCastPtr<PDFArray> subsectionsIndex;
  string local_c8;
  int *local_a8;
  RefCountPtr<PDFArray> local_a0;
  PDFParser *local_90;
  ulong local_88;
  IByteReader *local_80;
  ulong *local_78;
  XrefEntryInputVector *local_70;
  RefCountPtr<PDFDictionary> local_68;
  RefCountPtr<PDFInteger> local_58;
  RefCountPtr<PDFArray> local_48;
  PDFStreamInput *local_38;
  
  *outReadTableSize = inXrefSize;
  pIVar5 = CreateInputStreamReader(this,inXrefStream);
  if (pIVar5 == (IByteReader *)0x0) {
    EVar4 = eFailure;
    inEntryWidths = (int *)0x0;
    goto LAB_001daa92;
  }
  local_80 = pIVar5;
  local_38 = inXrefStream;
  pPVar6 = PDFStreamInput::QueryStreamDictionary(inXrefStream);
  local_68._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9720;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_68.mValue = pPVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"W","");
  pPVar7 = QueryDictionaryObject(this,pPVar6,&local_c8);
  local_a0.mValue = PDFObjectCast<PDFArray>(pPVar7);
  local_a0._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  if (local_a0.mValue == (PDFArray *)0x0) {
    pTVar11 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar11,"PDFParser::ParseXrefFromXrefStream, W array not available. failing");
    EVar4 = eFailure;
    inEntryWidths = (int *)0x0;
  }
  else {
    local_90 = this;
    local_88 = inXrefSize;
    local_78 = outReadTableSize;
    local_70 = inXrefTable;
    uVar8 = PDFArray::GetLength(local_a0.mValue);
    local_a8 = (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 << 2);
    uVar13 = 0;
    iVar14 = 0;
    do {
      uVar8 = PDFArray::GetLength(local_a0.mValue);
      if (uVar8 <= uVar13) break;
      pPVar7 = PDFArray::QueryObject(local_a0.mValue,uVar13);
      this_01 = PDFObjectCast<PDFInteger>(pPVar7);
      local_c8._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003ab0a0;
      local_c8._M_string_length = (size_type)this_01;
      if (this_01 == (PDFInteger *)0x0) {
        pTVar11 = Trace::DefaultTrace();
        iVar14 = -1;
        Trace::TraceToLog(pTVar11,
                          "PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)"
                         );
      }
      else {
        lVar9 = PDFInteger::GetValue(this_01);
        local_a8[uVar13] = (int)lVar9;
      }
      RefCountPtr<PDFInteger>::~RefCountPtr((RefCountPtr<PDFInteger> *)&local_c8);
      uVar13 = uVar13 + 1;
    } while (this_01 != (PDFInteger *)0x0);
    pPVar6 = local_68.mValue;
    EVar4 = eFailure;
    inEntryWidths = local_a8;
    if (iVar14 == 0) {
      paVar1 = &local_c8.field_2;
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Index","");
      this_00 = local_90;
      inEntryWidths = local_a8;
      pPVar7 = QueryDictionaryObject(local_90,pPVar6,&local_c8);
      uVar13 = local_88;
      local_48.mValue = PDFObjectCast<PDFArray>(pPVar7);
      local_48._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        (ulong)(local_c8.field_2._M_allocated_capacity + 1));
      }
      inOffsetFromStart = PDFStreamInput::GetStreamContentStart(local_38);
      InputOffsetStream::SetPosition(&this_00->mStream,inOffsetFromStart);
      PDFObjectParser::ResetReadState(&this_00->mObjectParser);
      pPVar6 = local_68.mValue;
      if (local_48.mValue == (PDFArray *)0x0) {
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Size","");
        pPVar7 = QueryDictionaryObject(this_00,pPVar6,&local_c8);
        local_58.mValue = PDFObjectCast<PDFInteger>(pPVar7);
        local_58._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003ab0a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,
                          (ulong)(local_c8.field_2._M_allocated_capacity + 1));
        }
        if (local_58.mValue == (PDFInteger *)0x0) {
          pTVar11 = Trace::DefaultTrace();
          EVar4 = eFailure;
          Trace::TraceToLog(pTVar11,
                            "PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream"
                           );
        }
        else {
          uVar12 = PDFInteger::GetValue(local_58.mValue);
          if (uVar13 < uVar12) {
            EVar4 = eSuccess;
            if (this_00->mAllowExtendingSegments != true) goto LAB_001daa5f;
            *local_78 = uVar12;
          }
          uVar8 = PDFArray::GetLength(local_a0.mValue);
          EVar4 = ReadXrefStreamSegment(this_00,local_70,0,uVar12,local_80,inEntryWidths,uVar8);
        }
LAB_001daa5f:
        RefCountPtr<PDFInteger>::~RefCountPtr(&local_58);
      }
      else {
        PDFArray::GetIterator(local_48.mValue);
        EVar4 = eSuccess;
        do {
          if ((pointer)local_c8.field_2._M_allocated_capacity == local_c8._M_dataplus._M_p) {
LAB_001da833:
            bVar2 = false;
          }
          else {
            if ((char)local_c8._M_string_length == '\x01') {
              local_c8._M_string_length = local_c8._M_string_length & 0xffffffffffffff00;
            }
            else {
              local_c8.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity + 8;
              if ((pointer)local_c8.field_2._M_allocated_capacity == local_c8._M_dataplus._M_p)
              goto LAB_001da833;
            }
            bVar2 = true;
          }
          inEntryWidths = local_a8;
          if ((EVar4 != eSuccess) || (!bVar2)) break;
          EVar3 = PDFObject::GetType(*(PDFObject **)local_c8.field_2._M_allocated_capacity);
          if (EVar3 != ePDFObjectInteger) {
            pTVar11 = Trace::DefaultTrace();
            EVar4 = eFailure;
            Trace::TraceToLog(pTVar11,
                              "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream"
                             );
            inEntryWidths = local_a8;
            break;
          }
          inSegmentStartObject =
               PDFInteger::GetValue(*(PDFInteger **)local_c8.field_2._M_allocated_capacity);
          if ((pointer)local_c8.field_2._M_allocated_capacity == local_c8._M_dataplus._M_p) {
LAB_001da8e7:
            pTVar11 = Trace::DefaultTrace();
            inFormat = 
            "PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values"
            ;
LAB_001da8fd:
            EVar4 = eFailure;
            bVar2 = false;
            Trace::TraceToLog(pTVar11,inFormat);
          }
          else {
            if ((char)local_c8._M_string_length == '\x01') {
              local_c8._M_string_length = local_c8._M_string_length & 0xffffffffffffff00;
            }
            else {
              local_c8.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity + 8;
              if ((pointer)local_c8.field_2._M_allocated_capacity == local_c8._M_dataplus._M_p)
              goto LAB_001da8e7;
            }
            EVar3 = PDFObject::GetType(*(PDFObject **)local_c8.field_2._M_allocated_capacity);
            if (EVar3 != ePDFObjectInteger) {
              pTVar11 = Trace::DefaultTrace();
              inFormat = 
              "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream"
              ;
              goto LAB_001da8fd;
            }
            uVar10 = PDFInteger::GetValue(*(PDFInteger **)local_c8.field_2._M_allocated_capacity);
            uVar13 = uVar10 + inSegmentStartObject;
            uVar12 = local_88;
            if (local_88 < uVar13) {
              bVar2 = false;
              EVar4 = eSuccess;
              if (local_90->mAllowExtendingSegments == true) {
                *local_78 = uVar13;
                uVar12 = uVar13;
                goto LAB_001da914;
              }
            }
            else {
LAB_001da914:
              uVar8 = PDFArray::GetLength(local_a0.mValue);
              uVar13 = uVar12 - inSegmentStartObject;
              if (uVar10 <= uVar12 - inSegmentStartObject) {
                uVar13 = uVar10;
              }
              EVar4 = ReadXrefStreamSegment
                                (local_90,local_70,inSegmentStartObject,uVar13,local_80,local_a8,
                                 uVar8);
              bVar2 = true;
              local_88 = uVar12;
            }
          }
          inEntryWidths = local_a8;
        } while (bVar2);
      }
      RefCountPtr<PDFArray>::~RefCountPtr(&local_48);
    }
  }
  RefCountPtr<PDFArray>::~RefCountPtr(&local_a0);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_68);
  pIVar5 = local_80;
LAB_001daa92:
  if (pIVar5 != (IByteReader *)0x0) {
    (*pIVar5->_vptr_IByteReader[1])();
  }
  if (inEntryWidths != (int *)0x0) {
    operator_delete__(inEntryWidths);
  }
  return EVar4;
}

Assistant:

EStatusCode PDFParser::ParseXrefFromXrefStream(XrefEntryInputVector& inXrefTable,
                                                   ObjectIDType inXrefSize,
                                                   PDFStreamInput* inXrefStream,
                                                   ObjectIDType* outReadTableSize)
{
	// 1. Setup the stream to read from the stream start location
	// 2. Set it up with an input stream to decode if required
	// 3. if there are subsections, loop them, otherwise assume a single section of 0..size
	// 4. for each subsection use the base number as starting, and count as well, to read the stream entries to the right position in the table
	//    The entries are read using the "W" value. make sure to read even values that you don't need.

	EStatusCode status = PDFHummus::eSuccess;

    *outReadTableSize = inXrefSize;

	IByteReader* xrefStreamSource = CreateInputStreamReader(inXrefStream);
	int* widthsArray = NULL;

	do
	{
		if(!xrefStreamSource)
		{
			status = PDFHummus::eFailure;
			break;
		}

		RefCountPtr<PDFDictionary> streamDictionary(inXrefStream->QueryStreamDictionary());

		// setup w array
		PDFObjectCastPtr<PDFArray> wArray(QueryDictionaryObject(streamDictionary.GetPtr(),"W"));
		if(!wArray)
		{
			TRACE_LOG("PDFParser::ParseXrefFromXrefStream, W array not available. failing");
			status = PDFHummus::eFailure;
			break;
		}

		widthsArray = new int[wArray->GetLength()];
		for(unsigned long i=0;i <wArray->GetLength();++i)
		{
			PDFObjectCastPtr<PDFInteger> widthObject(wArray->QueryObject(i));
			if(!widthObject)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)");
				status = PDFHummus::eFailure;
				break;
			}
			widthsArray[i] = (int)widthObject->GetValue();
		}
		if(status != PDFHummus::eSuccess)
			break;

		// read the segments from the stream
		PDFObjectCastPtr<PDFArray> subsectionsIndex(QueryDictionaryObject(streamDictionary.GetPtr(),"Index"));
		MovePositionInStream(inXrefStream->GetStreamContentStart());

		if(!subsectionsIndex)
		{
			PDFObjectCastPtr<PDFInteger> xrefSize(QueryDictionaryObject(streamDictionary.GetPtr(),"Size"));
			if(!xrefSize)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream");
				status = PDFHummus::eFailure;
				break;
			}

            // if reading objects past expected range interesting consult policy
            ObjectIDType readXrefSize = (ObjectIDType)xrefSize->GetValue();

            if(readXrefSize > inXrefSize)
            {
                if(mAllowExtendingSegments)
                {
                    inXrefSize = readXrefSize;
                    *outReadTableSize = readXrefSize;
                }
                else
                    break;
            }
			status = ReadXrefStreamSegment(inXrefTable,0,readXrefSize,xrefStreamSource,widthsArray,wArray->GetLength());
		}
		else
		{
			SingleValueContainerIterator<PDFObjectVector> segmentsIterator  = subsectionsIndex->GetIterator();
			PDFInteger* segmentValue;
			while(segmentsIterator.MoveNext() && PDFHummus::eSuccess == status)
			{
				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType startObject = (ObjectIDType)segmentValue->GetValue();
				if(!segmentsIterator.MoveNext())
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values");
					status = PDFHummus::eFailure;
					break;
				}

				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType objectsCount = (ObjectIDType)segmentValue->GetValue();
				ObjectIDType readXrefSize = startObject +  objectsCount;

				// if reading objects past expected range interesting consult policy
				if(readXrefSize > inXrefSize)
                {
                    if(mAllowExtendingSegments)
                    {
                        inXrefSize = readXrefSize;
                        *outReadTableSize = readXrefSize;
                    }
                    else
                        break;
                }
				status = ReadXrefStreamSegment(inXrefTable,startObject,std::min<ObjectIDType>(objectsCount,inXrefSize - startObject),xrefStreamSource,widthsArray,wArray->GetLength());
			}
		}
	}while(false);

	delete xrefStreamSource;
	delete[] widthsArray;
	return status;
}